

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariables.cxx
# Opt level: O3

array<dap::Variable> * __thiscall
cmDebugger::cmDebuggerVariables::HandleVariablesRequest
          (array<dap::Variable> *__return_storage_ptr__,cmDebuggerVariables *this)

{
  pointer pcVar1;
  pointer pVVar2;
  pointer pVVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  __normal_iterator<dap::Variable_*,_std::vector<dap::Variable,_std::allocator<dap::Variable>_>_>
  __i;
  string *psVar7;
  pointer pcVar8;
  pointer pVVar9;
  bool bVar10;
  vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
  values;
  vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
  local_1a8;
  undefined1 local_190 [96];
  _Alloc_hider local_130;
  char local_120 [16];
  integer local_110;
  undefined8 uStack_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  bool local_e8;
  _Alloc_hider local_e0;
  char local_d0 [16];
  bool local_c0;
  optional<dap::boolean> local_b8;
  _Alloc_hider local_b0;
  char local_a0 [16];
  bool local_90;
  bool local_88;
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined8 local_60;
  _Alloc_hider local_58;
  char local_48 [16];
  integer local_38;
  
  (__return_storage_ptr__->super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->GetKeyValuesFunction).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->GetKeyValuesFunction)._M_invoker)(&local_1a8,(_Any_data *)&this->GetKeyValuesFunction);
    if (local_1a8.
        super__Vector_base<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1a8.
        super__Vector_base<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      psVar7 = &(local_1a8.
                 super__Vector_base<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start)->Type;
      do {
        if (this->IgnoreEmptyStringEntries == true) {
          iVar5 = std::__cxx11::string::compare((char *)psVar7);
          if ((iVar5 != 0) || (psVar7[-1]._M_string_length != 0)) goto LAB_005b4397;
        }
        else {
LAB_005b4397:
          local_190._16_8_ = 0;
          local_190._24_8_ = 0;
          local_190._8_8_ = 0;
          local_190._32_8_ = 0;
          local_190._88_8_ = 0;
          local_190._80_8_ = 0;
          local_190._64_8_ = 0;
          local_190._40_8_ = 0;
          local_190._48_8_ = 0;
          local_190._56_8_ = local_190 + 0x48;
          local_190._72_8_ = 0;
          local_130._M_p = local_120;
          pcVar1 = (((cmDebuggerVariableEntry *)(psVar7 + -2))->Name)._M_dataplus._M_p;
          local_190._0_8_ = local_190 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_130,pcVar1,
                     pcVar1 + (((cmDebuggerVariableEntry *)(psVar7 + -2))->Name)._M_string_length);
          local_110.val = 0;
          uStack_108._0_1_ = false;
          uStack_108._1_7_ = 0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_100,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(anonymous_namespace)::PrivateDataHint);
          local_e8 = (bool)(anonymous_namespace)::PrivateDataHint[0x18];
          local_e0._M_p = local_d0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e0,(anonymous_namespace)::PrivateDataHint._32_8_,
                     (anonymous_namespace)::PrivateDataHint._40_8_ +
                     (anonymous_namespace)::PrivateDataHint._32_8_);
          local_c0 = (bool)(anonymous_namespace)::PrivateDataHint[0x40];
          local_b8.val.val = (bool)(anonymous_namespace)::PrivateDataHint[0x48];
          local_b8.set = (bool)(anonymous_namespace)::PrivateDataHint[0x49];
          local_b0._M_p = local_a0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,(anonymous_namespace)::PrivateDataHint._80_8_,
                     (anonymous_namespace)::PrivateDataHint._88_8_ +
                     (anonymous_namespace)::PrivateDataHint._80_8_);
          local_90 = (bool)(anonymous_namespace)::PrivateDataHint[0x70];
          local_88 = true;
          bVar10 = this->SupportsVariableType != true;
          if (bVar10) {
            local_80._M_p = (pointer)&local_70;
            local_70._M_allocated_capacity = 0;
            local_70._8_8_ = 0;
            local_60._0_1_ = false;
            local_60._1_7_ = 0;
            local_78 = 0;
          }
          else {
            local_80._M_p = (pointer)&local_70;
            pcVar1 = (psVar7->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_80,pcVar1,pcVar1 + psVar7->_M_string_length);
          }
          local_60._0_1_ = !bVar10;
          local_58._M_p = local_48;
          pcVar1 = psVar7[-1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_58,pcVar1,pcVar1 + psVar7[-1]._M_string_length);
          local_38.val = 0;
          std::vector<dap::Variable,_std::allocator<dap::Variable>_>::emplace_back<dap::Variable>
                    (__return_storage_ptr__,(Variable *)local_190);
          dap::Variable::~Variable((Variable *)local_190);
        }
        pcVar8 = (pointer)(psVar7 + 1);
        psVar7 = psVar7 + 3;
      } while (pcVar8 != local_1a8.
                         super__Vector_base<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
    ::~vector(&local_1a8);
  }
  EnumerateSubVariablesIfAny(this,__return_storage_ptr__);
  if (this->EnableSorting == true) {
    pVVar2 = (__return_storage_ptr__->
             super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pVVar3 = (__return_storage_ptr__->
             super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pVVar2 != pVVar3) {
      uVar6 = ((long)pVVar3 - (long)pVVar2 >> 5) * 0x2e8ba2e8ba2e8ba3;
      lVar4 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<dap::Variable*,std::vector<dap::Variable,std::allocator<dap::Variable>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cmDebugger::cmDebuggerVariables::HandleVariablesRequest()::__0>>
                (pVVar2,pVVar3,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)pVVar3 - (long)pVVar2 < 0x1601) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<dap::Variable*,std::vector<dap::Variable,std::allocator<dap::Variable>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmDebugger::cmDebuggerVariables::HandleVariablesRequest()::__0>>
                  (pVVar2,pVVar3);
      }
      else {
        pVVar9 = pVVar2 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<dap::Variable*,std::vector<dap::Variable,std::allocator<dap::Variable>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmDebugger::cmDebuggerVariables::HandleVariablesRequest()::__0>>
                  (pVVar2,pVVar9);
        for (; pVVar9 != pVVar3; pVVar9 = pVVar9 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<dap::Variable*,std::vector<dap::Variable,std::allocator<dap::Variable>>>,__gnu_cxx::__ops::_Val_comp_iter<cmDebugger::cmDebuggerVariables::HandleVariablesRequest()::__0>>
                    (pVVar9);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

dap::array<dap::Variable> cmDebuggerVariables::HandleVariablesRequest()
{
  dap::array<dap::Variable> variables;

  if (GetKeyValuesFunction != nullptr) {
    auto values = GetKeyValuesFunction();
    for (auto const& entry : values) {
      if (IgnoreEmptyStringEntries && entry.Type == "string" &&
          entry.Value.empty()) {
        continue;
      }
      variables.push_back(dap::Variable{
        {},
        {},
        {},
        entry.Name,
        {},
        PrivateDataHint,
        SupportsVariableType ? entry.Type : dap::optional<dap::string>(),
        entry.Value,
        0 });
    }
  }

  EnumerateSubVariablesIfAny(variables);

  if (EnableSorting) {
    std::sort(variables.begin(), variables.end(),
              [](dap::Variable const& a, dap::Variable const& b) {
                return a.name < b.name;
              });
  }
  return variables;
}